

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_bignum_quot_rem(sexp ctx,sexp_conflict *rem,sexp a,sexp b)

{
  void *pvVar1;
  sexp_conflict psVar2;
  long lVar3;
  char cVar4;
  sexp psVar5;
  sexp_uint_t sVar6;
  sexp psVar7;
  sexp_sint_t sVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  sexp b1;
  sexp x;
  sexp y;
  sexp local_110;
  sexp local_108;
  sexp local_100;
  sexp local_f8;
  sexp local_f0;
  sexp local_e8;
  sexp_uint_t local_e0;
  sexp_conflict *local_d8;
  long local_d0;
  ulong local_c8;
  ulong local_c0;
  sexp local_b8;
  long local_b0;
  sexp local_a8;
  sexp local_a0;
  sexp local_98;
  ulong local_90;
  ulong local_88;
  sexp *local_80;
  sexp_gc_var_t *local_78;
  sexp_gc_var_t local_70;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp *local_40;
  sexp **local_38;
  
  local_f8 = (sexp)&(b->value).type.slots;
  sVar6 = (b->value).string.offset;
  do {
    local_e0 = sVar6;
    if (local_e0 == 1) break;
    sVar6 = local_e0 - 1;
  } while (*(long *)((long)&b->value + local_e0 * 8 + 8) == 0);
  local_108 = (sexp)0x43e;
  local_f0 = (sexp)0x43e;
  local_a8 = (sexp)&DAT_0000043e;
  local_110 = (sexp)0x43e;
  local_100 = (sexp)0x43e;
  if ((local_e0 == 1) && (*(sexp *)local_f8 == (sexp)0x0)) {
    psVar5 = sexp_xtype_exception(ctx,(sexp)0x0,"divide by zero",a);
    return psVar5;
  }
  local_80 = &local_108;
  local_38 = &local_80;
  local_78 = (ctx->value).context.saves;
  local_40 = &local_f0;
  local_50.next = (sexp_gc_var_t *)&local_40;
  local_50.var = &local_a8;
  local_60.next = &local_50;
  local_60.var = &local_110;
  local_70.next = &local_60;
  local_70.var = &local_100;
  (ctx->value).context.saves = &local_70;
  uVar10 = (a->value).string.offset;
  local_e8 = b;
  local_d8 = rem;
  psVar5 = sexp_alloc_tagged_aux(ctx,uVar10 * 8 + 0x18,0xc);
  (psVar5->value).string.offset = uVar10;
  uVar12 = (a->value).string.offset;
  uVar11 = uVar10;
  if (uVar12 < uVar10) {
    uVar11 = uVar12;
  }
  (psVar5->value).flonum_bits[0] = (a->value).flonum_bits[0];
  pvVar1 = (void *)((long)&psVar5->value + 0x10);
  memset(pvVar1,0,uVar10 * 8);
  memmove(pvVar1,(void *)((long)&a->value + 0x10),uVar11 << 3);
  psVar7 = local_e8;
  (psVar5->value).flonum_bits[0] = '\x01';
  local_110 = psVar5;
  if (local_e0 == 1) {
    psVar7 = ctx;
    local_100 = sexp_alloc_tagged_aux(ctx,0x20,0xc);
    psVar5 = local_e8;
    if ((((ulong)local_100 & 3) != 0) || (local_100->tag != 0x13)) {
      (local_100->value).string.offset = 1;
      (local_100->value).flonum_bits[0] = '\x01';
    }
    sVar6 = sexp_bignum_fxdiv(psVar7,local_110,(local_e8->value).string.length,0);
    (local_100->value).string.length = sVar6;
    psVar7 = sexp_bignum_normalize(local_100);
    *local_d8 = psVar7;
    cVar4 = (a->value).flonum_bits[0];
    if ((int)(psVar5->value).flonum_bits[0] * (int)cVar4 < 0) {
      if ((((ulong)local_110 & 3) == 0) && (local_110->tag == 0xc)) {
        (local_110->value).flonum_bits[0] = -(local_110->value).flonum_bits[0];
        cVar4 = (a->value).flonum_bits[0];
      }
      else if (((ulong)local_110 & 1) != 0) {
        local_110 = (sexp)(1 - ((ulong)local_110 & 0xfffffffffffffffe));
      }
    }
    if (cVar4 < '\0') {
      psVar2 = *local_d8;
      if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0xc)) {
        (psVar2->value).flonum_bits[0] = -(psVar2->value).flonum_bits[0];
      }
      else if (((ulong)psVar2 & 1) != 0) {
        *local_d8 = (sexp_conflict)(1 - ((ulong)psVar2 & 0xfffffffffffffffe));
      }
    }
    (ctx->value).context.saves = local_78;
  }
  else {
    uVar10 = (local_e8->value).string.offset;
    psVar5 = sexp_alloc_tagged_aux(ctx,uVar10 * 8 + 0x18,0xc);
    (psVar5->value).string.offset = uVar10;
    uVar12 = (psVar7->value).string.offset;
    uVar11 = uVar10;
    if (uVar12 < uVar10) {
      uVar11 = uVar12;
    }
    (psVar5->value).flonum_bits[0] = (psVar7->value).flonum_bits[0];
    pvVar1 = (void *)((long)&psVar5->value + 0x10);
    memset(pvVar1,0,uVar10 * 8);
    memmove(pvVar1,local_f8,uVar11 << 3);
    (psVar5->value).flonum_bits[0] = '\x01';
    local_108 = (sexp)&DAT_00000001;
    local_100 = psVar5;
    local_a0 = a;
    local_f0 = sexp_make_bignum(ctx,(a->value).string.offset);
    psVar7 = local_100;
    psVar5 = local_110;
    sVar8 = sexp_bignum_compare_abs(local_110,local_100);
    if (sVar8 < 0) {
      bVar14 = 0;
    }
    else {
      local_d0 = -local_e0;
      lVar15 = 1;
      lVar13 = 0;
      local_98 = ctx;
      do {
        lVar3 = (psVar5->value).fileno.fd;
        do {
          lVar9 = lVar3;
          if (lVar9 == 1) break;
          lVar3 = lVar9 + -1;
        } while (*(long *)((long)&psVar5->value + lVar9 * 8 + 8) == 0);
        *(undefined8 *)((long)&local_f0->value + lVar13 * 8 + 0x10) = 0;
        if (0 < lVar13) {
          *(undefined8 *)((long)&local_f0->value + lVar13 * 8 + 8) = 0;
        }
        local_c0 = *(ulong *)((long)&psVar5->value + lVar9 * 8);
        local_88 = *(ulong *)((long)&psVar5->value + lVar9 * 8 + 8);
        local_90 = *(ulong *)((long)&psVar7->value + local_e0 * 8);
        local_c8 = *(ulong *)((long)&psVar7->value + local_e0 * 8 + 8);
        local_b8 = local_f0;
        uVar10 = local_c8;
        uVar12 = local_88;
        uVar11 = local_90;
        uVar16 = local_c0;
        if ((((2 < (long)local_e0) && (2 < lVar9)) && (local_88 >> 0x20 == 0)) &&
           (local_c8 >> 0x20 == 0)) {
          uVar10 = local_c8 << 0x20 | local_90 >> 0x20;
          uVar12 = local_88 << 0x20 | local_c0 >> 0x20;
          uVar11 = (ulong)*(uint *)(&psVar7->markedp + local_e0 * 8) | local_90 << 0x20;
          uVar16 = (ulong)*(uint *)(&psVar5->markedp + lVar9 * 8) | local_c0 << 0x20;
        }
        local_f8 = psVar7;
        local_b0 = lVar15;
        auVar17 = __udivti3(uVar16,uVar12,uVar11,uVar10);
        lVar15 = local_b0;
        psVar7 = local_f8;
        if (uVar12 < uVar10 || uVar12 - uVar10 < (ulong)(uVar16 < uVar11)) {
          uVar10 = local_c8;
          uVar12 = local_88;
          uVar11 = local_c0;
          if ((local_88 >> 0x20 == 0) && (local_c8 >> 0x20 == 0)) {
            uVar10 = local_c8 << 0x20 | local_90 >> 0x20;
            uVar12 = local_88 << 0x20 | local_c0 >> 0x20;
            uVar11 = local_c0 << 0x20 | (ulong)*(uint *)(&psVar5->markedp + lVar9 * 8);
          }
          lVar13 = lVar9 + local_d0;
          auVar17 = __udivti3(uVar11,uVar12,uVar10,0);
        }
        else {
          lVar13 = local_d0 + lVar9 + 1;
        }
        ctx = local_98;
        *(long *)((long)&local_b8->value + lVar13 * 8 + 0x10) = auVar17._8_8_;
        if (0 < lVar13) {
          *(long *)((long)&local_b8->value + lVar13 * 8 + 8) = auVar17._0_8_;
        }
        local_a8 = sexp_bignum_mul(local_98,(sexp)0x0,psVar7,local_b8);
        if (lVar15 < 0) {
          local_110 = sexp_bignum_add(ctx,(sexp)0x0,local_110,local_a8);
          local_108 = sexp_sub(ctx,local_108,local_f0);
        }
        else {
          local_110 = sexp_bignum_sub(ctx,(sexp)0x0,local_110,local_a8);
          local_108 = sexp_add(ctx,local_108,local_f0);
        }
        psVar7 = local_100;
        psVar5 = local_110;
        if (lVar15 != (local_110->value).flonum_bits[0]) {
          (local_110->value).flonum_bits[0] = -(char)lVar15;
          lVar15 = -lVar15;
        }
        sVar8 = sexp_bignum_compare_abs(local_110,local_100);
      } while (-1 < sVar8);
      bVar14 = (byte)((ulong)lVar15 >> 0x3f);
    }
    local_110 = sexp_bignum_normalize(psVar5);
    psVar5 = local_e8;
    if ((local_110 != (sexp)&DAT_00000001 & bVar14) == 1) {
      local_108 = sexp_sub(ctx,local_108,(sexp)&DAT_00000003);
      local_110 = sexp_add(ctx,local_110,local_100);
    }
    *local_d8 = local_110;
    cVar4 = (local_a0->value).flonum_bits[0];
    if ((int)(psVar5->value).flonum_bits[0] * (int)cVar4 < 0) {
      if ((((ulong)local_108 & 3) == 0) && (local_108->tag == 0xc)) {
        (local_108->value).flonum_bits[0] = -(local_108->value).flonum_bits[0];
        cVar4 = (local_a0->value).flonum_bits[0];
      }
      else if (((ulong)local_108 & 1) != 0) {
        local_108 = (sexp)(1 - ((ulong)local_108 & 0xfffffffffffffffe));
      }
    }
    if (cVar4 < '\0') {
      psVar2 = *local_d8;
      if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0xc)) {
        (psVar2->value).flonum_bits[0] = -(psVar2->value).flonum_bits[0];
      }
      else if (((ulong)psVar2 & 1) != 0) {
        *local_d8 = (sexp_conflict)(1 - ((ulong)psVar2 & 0xfffffffffffffffe));
      }
    }
    (ctx->value).context.saves = local_78;
    local_110 = local_108;
  }
  return local_110;
}

Assistant:

sexp sexp_bignum_quot_rem (sexp ctx, sexp *rem, sexp a, sexp b) {
  sexp_luint_t d, dn, dd;
  sexp_uint_t dlo, dhi;
  sexp_sint_t alen, blen=sexp_bignum_hi(b), sign=1, off=0;
  sexp_gc_var5(q, x, y, a1, b1);
  if (blen == 1 && sexp_bignum_data(b)[0] == 0)
    return sexp_xtype_exception(ctx, NULL, "divide by zero", a);
  sexp_gc_preserve5(ctx, q, x, y, a1, b1);
  a1 = sexp_copy_bignum(ctx, NULL, a, 0);
  sexp_bignum_sign(a1) = 1;
  /* fast path for single bigit divisor */
  if (blen == 1) {
    b1 = sexp_make_bignum(ctx, 1);
    sexp_bignum_data(b1)[0] = sexp_bignum_fxdiv(ctx, a1, sexp_bignum_data(b)[0], 0);
    *rem = sexp_bignum_normalize(b1);
    if (sexp_bignum_sign(a) * sexp_bignum_sign(b) < 0) {
      sexp_negate_exact(a1);
    }
    if (sexp_bignum_sign(a) < 0) {
      sexp_negate_exact(*rem);
    }
    sexp_gc_release5(ctx);
    return a1;
  }
  /* general case */
  b1 = sexp_copy_bignum(ctx, NULL, b, 0);
  sexp_bignum_sign(b1) = 1;
  q = SEXP_ZERO;
  x = sexp_make_bignum(ctx, sexp_bignum_length(a));
  while (sexp_bignum_compare_abs(a1, b1) >= 0) { /* a1, b1 at least 2 bigits */
    /* guess divisor x */
    alen = sexp_bignum_hi(a1);
    sexp_bignum_data(x)[off] = 0;
    if (off > 0) sexp_bignum_data(x)[off-1] = 0;
    off = alen - blen + 1;
    dn = luint_add_uint(luint_shl(luint_from_uint(sexp_bignum_data(a1)[alen-1])
           , (sizeof(sexp_uint_t)*8))
          , sexp_bignum_data(a1)[alen-2]);
    dd = luint_add_uint(luint_shl(luint_from_uint(sexp_bignum_data(b1)[blen-1])
           , (sizeof(sexp_uint_t)*8))
          , sexp_bignum_data(b1)[blen-2]);
    if (alen > 2 && blen > 2 &&
        luint_lt(luint_from_uint(sexp_bignum_data(a1)[alen-1]), luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4))) &&
        luint_lt(luint_from_uint(sexp_bignum_data(b1)[blen-1]), luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4)))) {
      dn = luint_add_uint(luint_shl(dn, (sizeof(sexp_uint_t)*4))
        , (sexp_bignum_data(a1)[alen-3] >> (sizeof(sexp_uint_t)*4)));
      dd = luint_add_uint(luint_shl(dd, (sizeof(sexp_uint_t)*4))
        , (sexp_bignum_data(b1)[blen-3] >> (sizeof(sexp_uint_t)*4)));
    }
    d = luint_div(dn, dd);
    if (luint_eq(d, luint_from_uint(0))) {
      dn = luint_add_uint(luint_shl(luint_from_uint(sexp_bignum_data(a1)[alen-1])
             , (sizeof(sexp_uint_t)*8))
            , sexp_bignum_data(a1)[alen-2]);
      dd = luint_from_uint(sexp_bignum_data(b1)[blen-1]);
      if (luint_lt(luint_from_uint(sexp_bignum_data(a1)[alen-1]), (luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4)))) &&
          luint_lt(luint_from_uint(sexp_bignum_data(b1)[blen-1]), (luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4))))) {
        dn = luint_add_uint(luint_shl(dn, (sizeof(sexp_uint_t)*4))
          , (sexp_bignum_data(a1)[alen-3] >> (sizeof(sexp_uint_t)*4)));
        dd = luint_add_uint(luint_shl(dd, (sizeof(sexp_uint_t)*4))
          , (sexp_bignum_data(b1)[blen-2] >> (sizeof(sexp_uint_t)*4)));
      }
      d = luint_div(dn, dd);
      off--;
    }
    dhi = luint_to_uint(luint_shr(d, (sizeof(sexp_uint_t)*8)));
    dlo = luint_to_uint(luint_and(d, luint_sub(luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*8)), luint_from_uint(1))));
    sexp_bignum_data(x)[off] = dhi;
    if (off > 0) sexp_bignum_data(x)[off-1] = dlo;
    /* update quotient q and remainder a1 estimates */
    y = sexp_bignum_mul(ctx, NULL, b1, x);
    if (sign < 0) {
      a1 = sexp_bignum_add(ctx, NULL, a1, y);
      q = sexp_sub(ctx, q, x);
    } else {
      a1 = sexp_bignum_sub(ctx, NULL, a1, y);
      q = sexp_add(ctx, q, x);
    }
    /* flip the sign if we overshot in our estimate */
    if (sexp_bignum_sign(a1) != sign) {
      sexp_bignum_sign(a1) = (char)(-sign);
      sign *= -1;
    }
  }
  /* adjust signs */
  a1 = sexp_bignum_normalize(a1);
  if (sign < 0 && a1 != SEXP_ZERO) {
    q = sexp_sub(ctx, q, SEXP_ONE);
    a1 = sexp_add(ctx, a1, b1);
  }
  *rem = a1;
  if (sexp_bignum_sign(a) * sexp_bignum_sign(b) < 0) {
    sexp_negate_exact(q);
  }
  if (sexp_bignum_sign(a) < 0) {
    sexp_negate_exact(*rem);
  }
  sexp_gc_release5(ctx);
  return q;
}